

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::MirFunction::display(MirFunction *this,ostream *o)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  pointer psVar5;
  _Self __tmp;
  VarId local_40;
  
  peVar1 = (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1->is_extern == true) {
    poVar3 = std::operator<<(o,"extern fn ");
    poVar3 = std::operator<<(poVar3,(string *)&this->name);
    std::operator<<(poVar3,"(");
    for (psVar5 = (peVar1->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 != (peVar1->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      if (psVar5 != (peVar1->params).
                    super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::operator<<(o,", ");
      }
      peVar2 = (psVar5->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
    }
    poVar3 = std::operator<<(o,") -> ");
    peVar2 = (peVar1->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,poVar3);
    poVar3 = std::operator<<(poVar3,";");
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  poVar3 = std::operator<<(o,"fn ");
  poVar3 = std::operator<<(poVar3,(string *)&this->name);
  std::operator<<(poVar3,"(");
  for (psVar5 = (peVar1->params).
                super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 != (peVar1->params).
                super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
    if (psVar5 != (peVar1->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(o,", ");
    }
    peVar2 = (psVar5->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,o);
  }
  poVar3 = std::operator<<(o,") -> ");
  peVar2 = (peVar1->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar2->super_Displayable)._vptr_Displayable)(peVar2,poVar3);
  poVar3 = std::operator<<(poVar3," {");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (p_Var4 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<(o,"\t");
    local_40.id = p_Var4[1]._M_color;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    VarId::display(&local_40,poVar3);
    poVar3 = std::operator<<(poVar3,": ");
    (**(code **)p_Var4[1]._M_parent)(&p_Var4[1]._M_parent,poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  for (p_Var4 = (this->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    (**(code **)p_Var4[1]._M_parent)(&p_Var4[1]._M_parent,o);
  }
  poVar3 = std::operator<<(o,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void MirFunction::display(std::ostream& o) const {
  auto& return_ty = type->ret;
  auto& params = type->params;
  if (type->is_extern) {
    o << "extern fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << ";" << std::endl;
  } else {
    o << "fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << " {" << std::endl;
    for (auto& i : variables) {
      o << "\t" << VarId(i.first) << ": " << i.second << std::endl;
      ;
    }
    for (auto i = basic_blks.begin(); i != basic_blks.end(); i++) {
      o << i->second;
    }
    o << "}" << std::endl;
  }
}